

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O0

void re2::SetUnanchored(void)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  LogMessage local_1aa0;
  LogMessage local_1920;
  LogMessage local_17a0;
  StringPiece local_1620;
  LogMessage local_1610;
  LogMessage local_1490;
  LogMessage local_1310;
  StringPiece local_1190;
  LogMessage local_1180;
  LogMessage local_1000;
  LogMessage local_e80;
  LogMessage local_d00;
  StringPiece local_b80;
  undefined1 local_b70 [8];
  vector<int,_std::allocator<int>_> v;
  StringPiece local_9d8;
  LogMessage local_9c8;
  StringPiece local_848;
  LogMessage local_838;
  StringPiece local_6b8;
  LogMessage local_6a8;
  LogMessage local_528;
  StringPiece local_3a8;
  LogMessage local_398;
  StringPiece local_218;
  LogMessage local_208;
  StringPiece local_78;
  Options local_68;
  undefined1 local_50 [8];
  Set s;
  
  RE2::Options::Options(&local_68,DefaultOptions);
  RE2::Set::Set((Set *)local_50,&local_68,UNANCHORED);
  StringPiece::StringPiece(&local_78,"foo");
  iVar2 = RE2::Set::Add((Set *)local_50,&local_78,(string *)0x0);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x12);
    poVar5 = LogMessage::stream(&local_208);
    std::operator<<(poVar5,"Check failed: (s.Add(\"foo\", __null)) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_208);
  }
  StringPiece::StringPiece(&local_218,"(");
  iVar2 = RE2::Set::Add((Set *)local_50,&local_218,(string *)0x0);
  if (iVar2 != -1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x13);
    poVar5 = LogMessage::stream(&local_398);
    std::operator<<(poVar5,"Check failed: (s.Add(\"(\", __null)) == (-1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_398);
  }
  StringPiece::StringPiece(&local_3a8,"bar");
  iVar2 = RE2::Set::Add((Set *)local_50,&local_3a8,(string *)0x0);
  if (iVar2 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x14);
    poVar5 = LogMessage::stream(&local_528);
    std::operator<<(poVar5,"Check failed: (s.Add(\"bar\", __null)) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_528);
  }
  bVar1 = RE2::Set::Compile((Set *)local_50);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x15);
    poVar5 = LogMessage::stream(&local_6a8);
    std::operator<<(poVar5,"Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6a8);
  }
  StringPiece::StringPiece(&local_6b8,"foobar");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_6b8,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_838,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x17);
    poVar5 = LogMessage::stream(&local_838);
    std::operator<<(poVar5,"Check failed: (s.Match(\"foobar\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_838);
  }
  StringPiece::StringPiece(&local_848,"fooba");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_848,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x18);
    poVar5 = LogMessage::stream(&local_9c8);
    std::operator<<(poVar5,"Check failed: (s.Match(\"fooba\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9c8);
  }
  StringPiece::StringPiece(&local_9d8,"oobar");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_9d8,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x19);
    poVar5 = LogMessage::stream((LogMessage *)
                                &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,"Check failed: (s.Match(\"oobar\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_b70);
  StringPiece::StringPiece(&local_b80,"foobar");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_b80,(vector<int,_std::allocator<int>_> *)local_b70)
  ;
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d00,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1c);
    poVar5 = LogMessage::stream(&local_d00);
    std::operator<<(poVar5,"Check failed: (s.Match(\"foobar\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d00);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b70);
  if (sVar3 != 2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e80,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1d);
    poVar5 = LogMessage::stream(&local_e80);
    std::operator<<(poVar5,"Check failed: (v.size()) == (2)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e80);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_b70,0);
  if (*pvVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1000,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1e);
    poVar5 = LogMessage::stream(&local_1000);
    std::operator<<(poVar5,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1000);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_b70,1);
  if (*pvVar4 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1180,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1f);
    poVar5 = LogMessage::stream(&local_1180);
    std::operator<<(poVar5,"Check failed: (v[1]) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1180);
  }
  StringPiece::StringPiece(&local_1190,"fooba");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_1190,(vector<int,_std::allocator<int>_> *)local_b70
                         );
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1310,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x21);
    poVar5 = LogMessage::stream(&local_1310);
    std::operator<<(poVar5,"Check failed: (s.Match(\"fooba\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1310);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b70);
  if (sVar3 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1490,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x22);
    poVar5 = LogMessage::stream(&local_1490);
    std::operator<<(poVar5,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1490);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_b70,0);
  if (*pvVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1610,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x23);
    poVar5 = LogMessage::stream(&local_1610);
    std::operator<<(poVar5,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1610);
  }
  StringPiece::StringPiece(&local_1620,"oobar");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_1620,(vector<int,_std::allocator<int>_> *)local_b70
                         );
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_17a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x25);
    poVar5 = LogMessage::stream(&local_17a0);
    std::operator<<(poVar5,"Check failed: (s.Match(\"oobar\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_17a0);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_b70);
  if (sVar3 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1920,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x26);
    poVar5 = LogMessage::stream(&local_1920);
    std::operator<<(poVar5,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1920);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_b70,0);
  if (*pvVar4 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1aa0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x27);
    poVar5 = LogMessage::stream(&local_1aa0);
    std::operator<<(poVar5,"Check failed: (v[0]) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1aa0);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b70);
  RE2::Set::~Set((Set *)local_50);
  return;
}

Assistant:

TEST(Set, Unanchored) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Add("foo", NULL), 0);
  CHECK_EQ(s.Add("(", NULL), -1);
  CHECK_EQ(s.Add("bar", NULL), 1);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("foobar", NULL), true);
  CHECK_EQ(s.Match("fooba", NULL), true);
  CHECK_EQ(s.Match("oobar", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("foobar", &v), true);
  CHECK_EQ(v.size(), 2);
  CHECK_EQ(v[0], 0);
  CHECK_EQ(v[1], 1);

  CHECK_EQ(s.Match("fooba", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);

  CHECK_EQ(s.Match("oobar", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 1);
}